

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_portability_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [2];
  undefined1 auStack_58 [84];
  undefined4 local_4;
  
  local_4 = 0;
  tellmeall();
  memcpy(auStack_58,&PTR_anon_var_dwarf_23_00180d80,0x50);
  iVar1 = _cmocka_run_group_tests
                    ((char *)tests[1].initial_state,(CMUnitTest *)tests[1].teardown_func,
                     (size_t)tests[1].setup_func,(CMFixtureFunction)tests[1].test_func,
                     (CMFixtureFunction)tests[1].name);
  return iVar1;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_deserialize_portable_norun),
        cmocka_unit_test(test_deserialize_portable_wrun),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}